

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O3

PolicyStatus statusForTarget(cmGeneratorTarget *tgt,char *policy)

{
  int iVar1;
  PolicyStatus PVar2;
  PolicyID id;
  
  iVar1 = strcmp(policy,"CMP0003");
  if (iVar1 == 0) {
    id = CMP0003;
  }
  else {
    iVar1 = strcmp(policy,"CMP0004");
    if (iVar1 == 0) {
      id = CMP0004;
    }
    else {
      iVar1 = strcmp(policy,"CMP0008");
      if (iVar1 == 0) {
        id = CMP0008;
      }
      else {
        iVar1 = strcmp(policy,"CMP0020");
        if (iVar1 == 0) {
          id = CMP0020;
        }
        else {
          iVar1 = strcmp(policy,"CMP0021");
          if (iVar1 == 0) {
            id = CMP0021;
          }
          else {
            iVar1 = strcmp(policy,"CMP0022");
            if (iVar1 == 0) {
              id = CMP0022;
            }
            else {
              iVar1 = strcmp(policy,"CMP0027");
              if (iVar1 == 0) {
                id = CMP0027;
              }
              else {
                iVar1 = strcmp(policy,"CMP0038");
                if (iVar1 == 0) {
                  id = CMP0038;
                }
                else {
                  iVar1 = strcmp(policy,"CMP0041");
                  if (iVar1 == 0) {
                    id = CMP0041;
                  }
                  else {
                    iVar1 = strcmp(policy,"CMP0042");
                    if (iVar1 == 0) {
                      id = CMP0042;
                    }
                    else {
                      iVar1 = strcmp(policy,"CMP0046");
                      if (iVar1 == 0) {
                        id = CMP0046;
                      }
                      else {
                        iVar1 = strcmp(policy,"CMP0052");
                        if (iVar1 == 0) {
                          id = CMP0052;
                        }
                        else {
                          iVar1 = strcmp(policy,"CMP0060");
                          if (iVar1 == 0) {
                            id = CMP0060;
                          }
                          else {
                            iVar1 = strcmp(policy,"CMP0063");
                            if (iVar1 == 0) {
                              id = CMP0063;
                            }
                            else {
                              iVar1 = strcmp(policy,"CMP0065");
                              if (iVar1 == 0) {
                                id = CMP0065;
                              }
                              else {
                                iVar1 = strcmp(policy,"CMP0068");
                                if (iVar1 == 0) {
                                  id = CMP0068;
                                }
                                else {
                                  iVar1 = strcmp(policy,"CMP0069");
                                  id = CMP0069;
                                  if (iVar1 != 0) {
                                    __assert_fail("false && \"Unreachable code. Not a valid policy\""
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmGeneratorExpressionNode.cxx"
                                                  ,0x584,
                                                  "cmPolicies::PolicyStatus statusForTarget(const cmGeneratorTarget *, const char *)"
                                                 );
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  PVar2 = cmPolicies::PolicyMap::Get(&tgt->PolicyMap,id);
  return PVar2;
}

Assistant:

cmPolicies::PolicyStatus statusForTarget(cmGeneratorTarget const* tgt,
                                         const char* policy)
{
#define RETURN_POLICY(POLICY)                                                 \
  if (strcmp(policy, #POLICY) == 0) {                                         \
    return tgt->GetPolicyStatus##POLICY();                                    \
  }

  CM_FOR_EACH_TARGET_POLICY(RETURN_POLICY)

#undef RETURN_POLICY

  assert(false && "Unreachable code. Not a valid policy");
  return cmPolicies::WARN;
}